

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushStyleVar(ImGuiStyleVar idx,float val)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  ImGuiStyleMod *pIVar4;
  ImGuiContext *pIVar5;
  int iVar6;
  ImGuiStyleMod *__dest;
  int iVar7;
  int iVar8;
  ImGuiContext *ctx;
  
  if (0x17 < (uint)idx) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x963,"GetStyleVarInfo","ImGui ASSERT FAILED: %s",
                "idx >= 0 && idx < ImGuiStyleVar_COUNT");
  }
  pIVar5 = GImGui;
  if (GStyleVarInfo[idx].Count == 1) {
    uVar3 = GStyleVarInfo[idx].Offset;
    iVar2 = *(int *)((long)&(GImGui->Style).Alpha + (ulong)uVar3);
    iVar6 = (GImGui->StyleModifiers).Size;
    if (iVar6 == (GImGui->StyleModifiers).Capacity) {
      if (iVar6 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar6 / 2 + iVar6;
      }
      iVar8 = iVar6 + 1;
      if (iVar6 + 1 < iVar7) {
        iVar8 = iVar7;
      }
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
      __dest = (ImGuiStyleMod *)(*GImAllocatorAllocFunc)((long)iVar8 * 0xc,GImAllocatorUserData);
      pIVar4 = (pIVar5->StyleModifiers).Data;
      if (pIVar4 != (ImGuiStyleMod *)0x0) {
        memcpy(__dest,pIVar4,(long)(pIVar5->StyleModifiers).Size * 0xc);
        pIVar4 = (pIVar5->StyleModifiers).Data;
        if ((pIVar4 != (ImGuiStyleMod *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      }
      (pIVar5->StyleModifiers).Data = __dest;
      (pIVar5->StyleModifiers).Capacity = iVar8;
      iVar6 = (pIVar5->StyleModifiers).Size;
    }
    else {
      __dest = (GImGui->StyleModifiers).Data;
    }
    __dest[iVar6].VarIdx = idx;
    __dest[iVar6].field_1.BackupInt[0] = iVar2;
    (pIVar5->StyleModifiers).Size = (pIVar5->StyleModifiers).Size + 1;
    *(float *)((long)&(pIVar5->Style).Alpha + (ulong)uVar3) = val;
    return;
  }
  LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
              ,0x973,"PushStyleVar","ImGui ASSERT FAILED: %s",
              "0 && \"Called PushStyleVar() float variant but variable is not a float!\"");
  return;
}

Assistant:

void ImGui::PushStyleVar(ImGuiStyleVar idx, float val)
{
    const ImGuiStyleVarInfo* var_info = GetStyleVarInfo(idx);
    if (var_info->Type == ImGuiDataType_Float && var_info->Count == 1)
    {
        ImGuiContext& g = *GImGui;
        float* pvar = (float*)var_info->GetVarPtr(&g.Style);
        g.StyleModifiers.push_back(ImGuiStyleMod(idx, *pvar));
        *pvar = val;
        return;
    }
    IM_ASSERT(0 && "Called PushStyleVar() float variant but variable is not a float!");
}